

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  _Base_ptr __s;
  bool bVar2;
  uint uVar3;
  cmake *pcVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  bool local_3d2;
  undefined1 local_3a8 [24];
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  _Base_ptr local_2f0;
  char *message;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  ostringstream w;
  undefined1 local_118 [7];
  bool in_try_compile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  PolicyStatus local_d8;
  byte local_d3;
  byte local_d2;
  allocator<char> local_d1;
  PolicyStatus cmp0069;
  string_view local_b0;
  allocator<char> local_99;
  string local_98;
  string_view local_78;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue feature;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  feature.Value = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"INTERPROCEDURAL_OPTIMIZATION",&local_51);
  local_30 = GetFeature(this,&local_50,feature.Value);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar2 = cmValue::IsOn(&local_30);
  if (bVar2) {
    bVar2 = std::operator!=(lang,"C");
    if ((((bVar2) && (bVar2 = std::operator!=(lang,"CXX"), bVar2)) &&
        (bVar2 = std::operator!=(lang,"CUDA"), bVar2)) &&
       (bVar2 = std::operator!=(lang,"Fortran"), bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = std::operator==(lang,"CUDA");
      if (bVar2) {
        std::allocator<char>::allocator();
        local_d2 = 0;
        local_d3 = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"CUDA_ARCHITECTURES",&local_99);
        psVar6 = GetSafeProperty(this,&local_98);
        local_78 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        bVar2 = cmIsOff(local_78);
        local_3d2 = true;
        if (!bVar2) {
          std::allocator<char>::allocator();
          local_d2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmp0069,"CUDA_SEPARABLE_COMPILATION",&local_d1);
          local_d3 = 1;
          psVar6 = GetSafeProperty(this,(string *)&cmp0069);
          local_b0 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
          local_3d2 = cmIsOff(local_b0);
        }
        if ((local_d3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&cmp0069);
        }
        if ((local_d2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_d1);
        }
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        if (local_3d2 != false) {
          return false;
        }
      }
      local_d8 = GetPolicyStatusCMP0069(this);
      if ((local_d8 == OLD) || (local_d8 == WARN)) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,"_CMAKE_",lang);
        std::operator+(&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,"_IPO_LEGACY_BEHAVIOR");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)local_118);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          bVar2 = cmake::GetIsInTryCompile(pcVar4);
          if ((local_d8 == WARN) && (!bVar2)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2b8,(cmPolicies *)0x45,id);
            poVar5 = std::operator<<((ostream *)local_298,(string *)&local_2b8);
            std::operator<<(poVar5,"\n");
            std::__cxx11::string::~string((string *)&local_2b8);
            poVar5 = std::operator<<((ostream *)local_298,
                                     "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
                                    );
            poVar5 = std::operator<<(poVar5,"\'");
            psVar6 = GetName_abi_cxx11_(this);
            poVar5 = std::operator<<(poVar5,(string *)psVar6);
            std::operator<<(poVar5,"\'.");
            pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
            std::__cxx11::ostringstream::str();
            GetBacktrace((cmGeneratorTarget *)&message);
            cmake::IssueMessage(pcVar4,AUTHOR_WARNING,&local_2d8,(cmListFileBacktrace *)&message);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&message);
            std::__cxx11::string::~string((string *)&local_2d8);
            this->PolicyReportedCMP0069 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        local_2f0 = (_Base_ptr)0x0;
        pcVar1 = this->Makefile;
        std::operator+(&local_330,"_CMAKE_",lang);
        std::operator+(&local_310,&local_330,"_IPO_SUPPORTED_BY_CMAKE");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pcVar1 = this->Makefile;
          std::operator+(&local_370,"_CMAKE_",lang);
          std::operator+(&local_350,&local_370,"_IPO_MAY_BE_SUPPORTED_BY_COMPILER");
          bVar2 = cmMakefile::IsOn(pcVar1,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2f])();
            if ((uVar3 & 1) == 0) {
              local_2f0 = (_Base_ptr)0xfd8d71;
            }
          }
          else {
            local_2f0 = (_Base_ptr)0xfd8d54;
          }
        }
        else {
          local_2f0 = (_Base_ptr)0xfd8d03;
        }
        if (local_2f0 == (_Base_ptr)0x0) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          this->PolicyReportedCMP0069 = true;
          pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          __s = local_2f0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,(char *)__s,(allocator<char> *)(local_3a8 + 0x17));
          GetBacktrace((cmGeneratorTarget *)local_3a8);
          cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_390,(cmListFileBacktrace *)local_3a8);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3a8);
          std::__cxx11::string::~string((string *)&local_390);
          std::allocator<char>::~allocator((allocator<char> *)(local_3a8 + 0x17));
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  cmValue feature = this->GetFeature("INTERPROCEDURAL_OPTIMIZATION", config);

  if (!feature.IsOn()) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "CUDA" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  if (lang == "CUDA") {
    // CUDA IPO requires both CUDA_ARCHITECTURES and CUDA_SEPARABLE_COMPILATION
    if (cmIsOff(this->GetSafeProperty("CUDA_ARCHITECTURES")) ||
        cmIsOff(this->GetSafeProperty("CUDA_SEPARABLE_COMPILATION"))) {
      return false;
    }
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = nullptr;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}